

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Implementation.hpp
# Opt level: O0

ssize_t __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::write
          (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this,int __fd,
          void *__buf,size_t __n)

{
  bool bVar1;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *pMVar2;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_00;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_01;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_02;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_03;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_04;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_05;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_06;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_07;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_08;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_09;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_10;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_11;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_12;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *extraout_RAX_13;
  LogLine local_20;
  byte local_15;
  uint local_14;
  uint8_t value_local;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *pMStack_10;
  int address_local;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this_local;
  
  local_15 = (byte)__buf;
  local_14 = __fd & 0xf;
  pMVar2 = (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *)
           ((ulong)local_14 - 0xf);
  if ((ulong)local_14 < 0xf ||
      pMVar2 == (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *)0x0) {
    pMStack_10 = this;
    switch(local_14) {
    case 0:
      (this->super_MOS6526Storage).output_[0] = local_15;
      set_port_output<0>(this);
      pMVar2 = extraout_RAX;
      break;
    case 1:
      (this->super_MOS6526Storage).output_[1] = local_15;
      set_port_output<1>(this);
      pMVar2 = extraout_RAX_00;
      break;
    case 2:
      (this->super_MOS6526Storage).data_direction_[0] = local_15;
      set_port_output<0>(this);
      pMVar2 = extraout_RAX_01;
      break;
    case 3:
      (this->super_MOS6526Storage).data_direction_[1] = local_15;
      set_port_output<1>(this);
      pMVar2 = extraout_RAX_02;
      break;
    case 4:
      MOS6526Storage::Counter::set_reload<0,true>((this->super_MOS6526Storage).counter_,local_15);
      pMVar2 = extraout_RAX_03;
      break;
    case 5:
      MOS6526Storage::Counter::set_reload<8,true>((this->super_MOS6526Storage).counter_,local_15);
      pMVar2 = extraout_RAX_04;
      break;
    case 6:
      MOS6526Storage::Counter::set_reload<0,true>
                ((this->super_MOS6526Storage).counter_ + 1,local_15);
      pMVar2 = extraout_RAX_05;
      break;
    case 7:
      MOS6526Storage::Counter::set_reload<8,true>
                ((this->super_MOS6526Storage).counter_ + 1,local_15);
      pMVar2 = extraout_RAX_06;
      break;
    case 8:
      TODStorage<true>::write<0>(&this->tod_,local_15);
      pMVar2 = extraout_RAX_07;
      break;
    case 9:
      TODStorage<true>::write<1>(&this->tod_,local_15);
      pMVar2 = extraout_RAX_08;
      break;
    case 10:
      TODStorage<true>::write<2>(&this->tod_,local_15);
      pMVar2 = extraout_RAX_09;
      break;
    case 0xb:
      TODStorage<true>::write<3>(&this->tod_,local_15);
      pMVar2 = extraout_RAX_10;
      break;
    case 0xc:
      Log::Logger<(Log::Source)21>::error((Logger<(Log::Source)21> *)&local_20);
      Log::Logger<(Log::Source)21>::LogLine::append(&local_20,"TODO: write to shift register");
      Log::Logger<(Log::Source)21>::LogLine::~LogLine(&local_20);
      pMVar2 = extraout_RAX_13;
      break;
    case 0xd:
      if (((ulong)__buf & 0x80) == 0) {
        (this->super_MOS6526Storage).interrupt_control_ =
             (this->super_MOS6526Storage).interrupt_control_ & (local_15 & 0x7f ^ 0xff);
      }
      else {
        (this->super_MOS6526Storage).interrupt_control_ =
             (this->super_MOS6526Storage).interrupt_control_ | local_15 & 0x7f;
      }
      update_interrupts(this);
      pMVar2 = extraout_RAX_11;
      break;
    case 0xe:
      MOS6526Storage::Counter::set_control<false>((this->super_MOS6526Storage).counter_,local_15);
      TODBase::set_control<false>(&(this->tod_).super_TODBase,local_15);
      bVar1 = (bool)((this->super_MOS6526Storage).shifter_is_output_ & 1);
      pMVar2 = (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *)(ulong)bVar1;
      if (bVar1 != ((local_15 & 0x40) != 0)) {
        (this->super_MOS6526Storage).shifter_is_output_ = (local_15 & 0x40) != 0;
        (this->super_MOS6526Storage).shift_bits_ = 0;
        pMVar2 = this;
      }
      break;
    case 0xf:
      MOS6526Storage::Counter::set_control<true>((this->super_MOS6526Storage).counter_ + 1,local_15)
      ;
      TODBase::set_control<true>(&(this->tod_).super_TODBase,local_15);
      pMVar2 = extraout_RAX_12;
    }
  }
  return (ssize_t)pMVar2;
}

Assistant:

void MOS6526<BusHandlerT, personality>::write(int address, uint8_t value) {
	address &= 0xf;
	switch(address) {
		// Port output.
		case 0:
			output_[0] = value;
			set_port_output<0>();
		break;
		case 1:
			output_[1] = value;
			set_port_output<1>();
		break;

		// Port direction.
		case 2:
			data_direction_[0] = value;
			set_port_output<0>();
		break;
		case 3:
			data_direction_[1] = value;
			set_port_output<1>();
		break;

		// Counters; writes set the reload values.
		case 4:		counter_[0].template set_reload<0, personality == Personality::P8250>(value);	break;
		case 5:		counter_[0].template set_reload<8, personality == Personality::P8250>(value);	break;
		case 6:		counter_[1].template set_reload<0, personality == Personality::P8250>(value);	break;
		case 7:		counter_[1].template set_reload<8, personality == Personality::P8250>(value);	break;

		// Time-of-day clock.
		case 8:		tod_.template write<0>(value);	break;
		case 9:		tod_.template write<1>(value);	break;
		case 10:	tod_.template write<2>(value);	break;
		case 11:	tod_.template write<3>(value);	break;

		// Interrupt control.
		case 13: {
			if(value & 0x80) {
				interrupt_control_ |= value & 0x7f;
			} else {
				interrupt_control_ &= ~(value & 0x7f);
			}
			update_interrupts();
		} break;

		// Control. Posted to both the counters and the clock as it affects both.
		case 14:
			counter_[0].template set_control<false>(value);
			tod_.template set_control<false>(value);
			if(shifter_is_output_ != bool(value & 0x40)) {
				shifter_is_output_ = value & 0x40;
				shift_bits_ = 0;
			}
		break;
		case 15:
			counter_[1].template set_control<true>(value);
			tod_.template set_control<true>(value);
		break;

		// Shift control.
		case 12:
			log.error().append("TODO: write to shift register");
		break;

		// Logically unreachable.
		default: break;
	}
}